

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBucket.cpp
# Opt level: O0

bool __thiscall
Memory::HeapBucketGroup<MediumAllocationBlockAttributes>::AllocatorsAreEmpty
          (HeapBucketGroup<MediumAllocationBlockAttributes> *this)

{
  bool bVar1;
  bool local_11;
  HeapBucketGroup<MediumAllocationBlockAttributes> *this_local;
  
  bVar1 = HeapBucketT<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>_>::
          AllocatorsAreEmpty((HeapBucketT<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>_>
                              *)this);
  local_11 = false;
  if (bVar1) {
    bVar1 = HeapBucketT<Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>_>::
            AllocatorsAreEmpty((HeapBucketT<Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>_>
                                *)&this->finalizableHeapBucket);
    local_11 = false;
    if (bVar1) {
      bVar1 = HeapBucketT<Memory::SmallLeafHeapBlockT<MediumAllocationBlockAttributes>_>::
              AllocatorsAreEmpty(&(this->leafHeapBucket).
                                  super_HeapBucketT<Memory::SmallLeafHeapBlockT<MediumAllocationBlockAttributes>_>
                                );
      local_11 = false;
      if (bVar1) {
        bVar1 = HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
                ::AllocatorsAreEmpty
                          ((HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
                            *)&this->smallNormalWithBarrierHeapBucket);
        local_11 = false;
        if (bVar1) {
          local_11 = HeapBucketT<Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
                     ::AllocatorsAreEmpty
                               ((HeapBucketT<Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
                                 *)&this->smallFinalizableWithBarrierHeapBucket);
        }
      }
    }
  }
  return local_11;
}

Assistant:

bool
HeapBucketGroup<TBlockAttributes>::AllocatorsAreEmpty()
{
    return heapBucket.AllocatorsAreEmpty()
        && finalizableHeapBucket.AllocatorsAreEmpty()
#ifdef RECYCLER_VISITED_HOST
        && recyclerVisitedHostHeapBucket.AllocatorsAreEmpty()
#endif
        && leafHeapBucket.AllocatorsAreEmpty()
#ifdef RECYCLER_WRITE_BARRIER
        && smallNormalWithBarrierHeapBucket.AllocatorsAreEmpty()
        && smallFinalizableWithBarrierHeapBucket.AllocatorsAreEmpty()
#endif
        ;
}